

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_sub_module_remove_devs_augs(lys_module *module)

{
  uint uVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if (module->deviation_size != '\0') {
    lVar4 = 0;
    uVar5 = 0;
    do {
      remove_dev((lys_deviation *)((long)&module->deviation->target_name + lVar4),module);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (uVar5 < module->deviation_size);
  }
  if (module->augment_size != '\0') {
    lVar4 = 0;
    uVar5 = 0;
    do {
      remove_aug((lys_node_augment *)(module->augment->padding + lVar4 + -0x1c));
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x68;
    } while (uVar5 < module->augment_size);
  }
  if (module->inc_size != '\0') {
    bVar2 = 0;
    do {
      uVar1 = (uint)bVar2;
      if (*(long *)(module->inc->rev + ((ulong)(uVar1 * 0x30) - 8)) == 0) {
        return;
      }
      lVar4 = *(long *)(module->inc->rev + ((ulong)(uVar1 * 0x30) - 8));
      if (*(char *)(lVar4 + 0x49) != '\0') {
        lVar3 = 0;
        uVar5 = 0;
        do {
          remove_dev((lys_deviation *)(*(long *)(lVar4 + 0x88) + lVar3),module);
          uVar5 = uVar5 + 1;
          lVar4 = *(long *)(module->inc->rev + ((ulong)(uVar1 * 0x30) - 8));
          lVar3 = lVar3 + 0x38;
        } while (uVar5 < *(byte *)(lVar4 + 0x49));
      }
      lVar4 = *(long *)(module->inc->rev + ((ulong)(uVar1 * 0x30) - 8));
      if (*(char *)(lVar4 + 0x48) != '\0') {
        lVar3 = 0;
        uVar5 = 0;
        do {
          remove_aug((lys_node_augment *)(*(long *)(lVar4 + 0x80) + lVar3));
          uVar5 = uVar5 + 1;
          lVar4 = *(long *)(module->inc->rev + ((ulong)(uVar1 * 0x30) - 8));
          lVar3 = lVar3 + 0x68;
        } while (uVar5 < *(byte *)(lVar4 + 0x48));
      }
      bVar2 = bVar2 + 1;
    } while (bVar2 < module->inc_size);
  }
  return;
}

Assistant:

void
lys_sub_module_remove_devs_augs(struct lys_module *module)
{
    uint8_t u, v;

    /* remove applied deviations */
    for (u = 0; u < module->deviation_size; ++u) {
        remove_dev(&module->deviation[u], module);
    }
    /* remove applied augments */
    for (u = 0; u < module->augment_size; ++u) {
        remove_aug(&module->augment[u]);
    }

    /* remove deviation and augments defined in submodules */
    for (v = 0; v < module->inc_size && module->inc[v].submodule; ++v) {
        for (u = 0; u < module->inc[v].submodule->deviation_size; ++u) {
            remove_dev(&module->inc[v].submodule->deviation[u], module);
        }

        for (u = 0; u < module->inc[v].submodule->augment_size; ++u) {
            remove_aug(&module->inc[v].submodule->augment[u]);
        }
    }
}